

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin.cpp
# Opt level: O1

void Jupiter::Plugin::free(void *__ptr)

{
  iterator __position;
  dlib *this;
  code *pcVar1;
  pointer __src;
  
  if (__ptr < (void *)((long)g_plugins.
                             super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)g_plugins.
                             super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    __src = g_plugins.super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>.
            _M_impl.super__Vector_impl_data._M_start + (long)__ptr + 1;
    if (__src != g_plugins.super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
      memmove(g_plugins.super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>.
              _M_impl.super__Vector_impl_data._M_start + (long)__ptr,__src,
              (long)g_plugins.
                    super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)__src);
    }
    g_plugins.super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         g_plugins.super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>._M_impl
         .super__Vector_impl_data._M_finish + -1;
    __position._M_current =
         g_libList.
         super__Vector_base<std::unique_ptr<dlib,_std::default_delete<dlib>_>,_std::allocator<std::unique_ptr<dlib,_std::default_delete<dlib>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start + (long)__ptr;
    this = ((__position._M_current)->_M_t).super___uniq_ptr_impl<dlib,_std::default_delete<dlib>_>.
           _M_t.super__Tuple_impl<0UL,_dlib_*,_std::default_delete<dlib>_>.
           super__Head_base<0UL,_dlib_*,_false>._M_head_impl;
    ((__position._M_current)->_M_t).super___uniq_ptr_impl<dlib,_std::default_delete<dlib>_>._M_t.
    super__Tuple_impl<0UL,_dlib_*,_std::default_delete<dlib>_>.super__Head_base<0UL,_dlib_*,_false>.
    _M_head_impl = (dlib *)0x0;
    std::
    vector<std::unique_ptr<dlib,_std::default_delete<dlib>_>,_std::allocator<std::unique_ptr<dlib,_std::default_delete<dlib>_>_>_>
    ::_M_erase(&g_libList,__position);
    pcVar1 = (code *)dlsym(this->lib,"unload");
    if (pcVar1 != (code *)0x0) {
      (*pcVar1)();
    }
    dlib::~dlib(this);
    operator_delete(this,8);
  }
  return;
}

Assistant:

bool Jupiter::Plugin::free(size_t index) {
	if (index < g_plugins.size()) {
		// Do not free() the plugin; plugin gets free'd either by FreeLibrary() during static memory deallocation or unload.
		g_plugins.erase(g_plugins.begin() + index);
		auto dPlugItr = g_libList.begin() + index;
		std::unique_ptr<dlib> dPlug = std::move(*dPlugItr);
		g_libList.erase(dPlugItr);

		typedef void(*func_type)(void);
#if defined _WIN32
		func_type unload_func = (func_type)GetProcAddress(dPlug->lib, "unload");
#else // _WIN32
		func_type unload_func = (func_type)dlsym(dPlug->lib, "unload");
#endif // _WIN32
		if (unload_func != nullptr) {
			unload_func();
		}
		return true;
	}
	return false;
}